

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O2

void arith_uint256_tests::shiftArrayRight(uchar *to,uchar *from,uint arrayLength,uint bitsToShift)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (ulong)(arrayLength >> 3);
  bVar3 = (byte)arrayLength & 7;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    if (uVar4 + lVar5 < 0x20) {
      bVar2 = from[lVar5 + uVar4] >> bVar3;
      to[lVar5] = bVar2;
      if (0x1f - uVar4 != lVar5) {
        to[lVar5] = bVar2 | from[lVar5 + uVar4 + 1] << (8 - bVar3 & 0x1f);
      }
    }
    else {
      to[lVar5] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void shiftArrayRight(unsigned char* to, const unsigned char* from, unsigned int arrayLength, unsigned int bitsToShift)
{
    for (unsigned int T=0; T < arrayLength; ++T)
    {
        unsigned int F = (T+bitsToShift/8);
        if (F < arrayLength)
            to[T] = uint8_t(from[F] >> (bitsToShift % 8));
        else
            to[T] = 0;
        if (F + 1 < arrayLength)
            to[T] |= uint8_t(from[(F + 1)] << (8 - bitsToShift % 8));
    }
}